

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O3

int Gia_PolynHandleOne(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs,
                      Vec_Wec_t *vLit2Mono,Vec_Int_t *vTempC,Vec_Int_t *vTempM,int iMono,int iLitOld
                      ,int iLitNew0,int iLitNew1)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  if ((-1 < iMono) && (iMono < vCoefs->nSize)) {
    iVar2 = vCoefs->pArray[(uint)iMono];
    if ((-1 < (long)iVar2) && (iVar2 < pHashC->vMap->nSize)) {
      iVar2 = pHashC->vMap->pArray[iVar2];
      if ((-1 < (long)iVar2) && (iVar2 < pHashC->vData->nSize)) {
        piVar1 = pHashC->vData->pArray + (long)iVar2 + 2;
        iVar2 = piVar1[-2];
        (pHashC->vTemp).nCap = iVar2;
        (pHashC->vTemp).nSize = iVar2;
        (pHashC->vTemp).pArray = piVar1;
        if (pHashM->vMap->nSize <= iMono) goto LAB_0066deb9;
        iVar2 = pHashM->vMap->pArray[(uint)iMono];
        if ((-1 < (long)iVar2) && (iVar2 < pHashM->vData->nSize)) {
          piVar1 = pHashM->vData->pArray + iVar2;
          iVar2 = *piVar1;
          (pHashM->vTemp).nCap = iVar2;
          (pHashM->vTemp).nSize = iVar2;
          (pHashM->vTemp).pArray = piVar1 + 2;
          vTempM->nSize = 0;
          if (0 < (pHashM->vTemp).nSize) {
            lVar3 = 0;
            do {
              Vec_IntPush(vTempM,(pHashM->vTemp).pArray[lVar3]);
              lVar3 = lVar3 + 1;
            } while (lVar3 < (pHashM->vTemp).nSize);
            iVar2 = vTempM->nSize;
            if ((long)iVar2 < 1) {
              if (iVar2 != 0) {
                __assert_fail("i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
              }
            }
            else {
              piVar1 = vTempM->pArray;
              lVar3 = 1;
              do {
                if (piVar1[lVar3 + -1] == iLitOld) {
                  if ((int)lVar3 < iVar2) {
                    do {
                      piVar1[lVar3 + -1] = piVar1[lVar3];
                      lVar3 = lVar3 + 1;
                      iVar2 = vTempM->nSize;
                    } while ((int)lVar3 < iVar2);
                  }
                  vTempM->nSize = iVar2 + -1;
                  if ((iLitNew1 & iLitNew0) == 0xffffffff) {
                    vTempC->nSize = 0;
                    if (0 < (pHashC->vTemp).nSize) {
                      lVar3 = 0;
                      do {
                        Vec_IntPushOrderAbs(vTempC,(pHashC->vTemp).pArray[lVar3]);
                        lVar3 = lVar3 + 1;
                      } while (lVar3 < (pHashC->vTemp).nSize);
                    }
                  }
                  else {
                    if (iLitNew0 < 0 || iLitNew1 != -1) {
                      if ((iLitNew1 | iLitNew0) < 0) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                                      ,0x1fc,
                                      "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                                     );
                      }
                      vTempC->nSize = 0;
                      if (0 < (pHashC->vTemp).nSize) {
                        lVar3 = 0;
                        do {
                          Vec_IntPushOrderAbs(vTempC,(pHashC->vTemp).pArray[lVar3]);
                          lVar3 = lVar3 + 1;
                        } while (lVar3 < (pHashC->vTemp).nSize);
                      }
                      Vec_IntPushUniqueOrder(vTempM,iLitNew0);
                    }
                    else {
                      vTempC->nSize = 0;
                      iLitNew1 = iLitNew0;
                      if (0 < (pHashC->vTemp).nSize) {
                        lVar3 = 0;
                        do {
                          Vec_IntPushOrderAbs(vTempC,-(pHashC->vTemp).pArray[lVar3]);
                          lVar3 = lVar3 + 1;
                        } while (lVar3 < (pHashC->vTemp).nSize);
                      }
                    }
                    Vec_IntPushUniqueOrder(vTempM,iLitNew1);
                  }
                  iVar2 = Gia_PolynBuildAdd(pHashC,pHashM,vCoefs,vLit2Mono,vTempC,vTempM);
                  return iVar2;
                }
                bVar4 = lVar3 != iVar2;
                lVar3 = lVar3 + 1;
              } while (bVar4);
            }
          }
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                        ,0x1ed,
                        "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                       );
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
LAB_0066deb9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Gia_PolynHandleOne( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs, 
                                      Vec_Wec_t * vLit2Mono, Vec_Int_t * vTempC, Vec_Int_t * vTempM, 
                                      int iMono, int iLitOld, int iLitNew0, int iLitNew1 )
{
    int status, iConst = Vec_IntEntry( vCoefs, iMono );
    Vec_Int_t * vArrayC = Hsh_VecReadEntry( pHashC, iConst );
    Vec_Int_t * vArrayM = Hsh_VecReadEntry( pHashM, iMono );
    // create new monomial
    Vec_IntClear( vTempM );
    Vec_IntAppend( vTempM, vArrayM );
    status = Vec_IntRemove( vTempM, iLitOld );
    assert( status );
    // create new monomial
    if ( iLitNew0 == -1 && iLitNew1 == -1 )     // no new lit - the same const
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
    else if ( iLitNew0 > -1 && iLitNew1 == -1 ) // one new lit - opposite const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 1 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
    }
    else if ( iLitNew0 > -1 && iLitNew1 > -1 )  // both new lit - the same const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew1 );
    }
    else assert( 0 );
    return Gia_PolynBuildAdd( pHashC, pHashM, vCoefs, vLit2Mono, vTempC, vTempM );
}